

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<float,_2,_3> *
tcu::operator-(Matrix<float,_2,_3> *__return_storage_ptr__,Matrix<float,_2,_3> *a,
              Matrix<float,_2,_3> *b)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  undefined4 local_2c;
  undefined4 local_28;
  int row;
  int col;
  Matrix<float,_2,_3> *b_local;
  Matrix<float,_2,_3> *a_local;
  Matrix<float,_2,_3> *res;
  
  Matrix<float,_2,_3>::Matrix(__return_storage_ptr__);
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      pfVar3 = Matrix<float,_2,_3>::operator()(a,local_2c,local_28);
      fVar1 = *pfVar3;
      pfVar3 = Matrix<float,_2,_3>::operator()(b,local_2c,local_28);
      fVar2 = *pfVar3;
      pfVar3 = Matrix<float,_2,_3>::operator()(__return_storage_ptr__,local_2c,local_28);
      *pfVar3 = fVar1 - fVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows, Cols> operator- (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) - b(row, col);
	return res;
}